

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecHelper.cpp
# Opt level: O1

DataType getType(string *typeString)

{
  byte bVar1;
  DataType DVar2;
  string_view trimCharacters;
  string_view sVar3;
  string_view in_stack_00000000;
  
  sVar3._M_str = (typeString->_M_dataplus)._M_p;
  sVar3._M_len = typeString->_M_string_length;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  sVar3 = gmlc::utilities::string_viewOps::trim(sVar3,trimCharacters);
  if (sVar3._M_len == 0) {
    return HELICS_CUSTOM;
  }
  if (sVar3._M_len != 1) {
    DVar2 = helics::getTypeFromString(in_stack_00000000);
    return DVar2;
  }
  bVar1 = *sVar3._M_str;
  DVar2 = HELICS_ANY;
  if (bVar1 < 0x61) {
    switch(bVar1) {
    case 0x41:
      goto switchD_001bcf87_caseD_41;
    case 0x42:
    case 0x45:
    case 0x47:
    case 0x48:
      break;
    case 0x43:
switchD_001bcf87_caseD_41:
      return HELICS_COMPLEX;
    case 0x44:
    case 0x46:
switchD_001bcf87_caseD_41:
      return HELICS_DOUBLE;
    case 0x49:
switchD_001bcf87_caseD_41:
      return HELICS_INT;
    default:
      if (bVar1 == 0x53) {
        return HELICS_STRING;
      }
      if (bVar1 == 0x56) {
        return HELICS_VECTOR;
      }
    }
  }
  else {
    switch(bVar1) {
    case 0x61:
      goto switchD_001bcf87_caseD_41;
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x68:
      break;
    case 99:
      goto switchD_001bcf87_caseD_41;
    case 100:
    case 0x66:
      goto switchD_001bcf87_caseD_41;
    case 0x69:
      goto switchD_001bcf87_caseD_41;
    default:
      if (bVar1 == 0x76) {
        return HELICS_VECTOR;
      }
      if (bVar1 == 0x73) {
        return HELICS_STRING;
      }
    }
  }
  DVar2 = HELICS_CUSTOM;
switchD_001bcf87_caseD_41:
  return DVar2;
}

Assistant:

DataType getType(const std::string& typeString)
{
    auto tstr = gmlc::utilities::string_viewOps::trim(typeString);
    // trim the string
    if (tstr.empty()) {
        return DataType::HELICS_CUSTOM;
    }
    if (tstr.size() == 1) {
        switch (tstr[0]) {
            case 'a':
            case 'A':
                return DataType::HELICS_ANY;
            case 's':
            case 'S':
                return DataType::HELICS_STRING;
            case 'd':
            case 'D':
            case 'f':
            case 'F':
                return DataType::HELICS_DOUBLE;
            case 'i':
            case 'I':
                return DataType::HELICS_INT;
            case 'c':
            case 'C':
                return DataType::HELICS_COMPLEX;
            case 'v':
            case 'V':
                return DataType::HELICS_VECTOR;
            default:
                return DataType::HELICS_CUSTOM;
        }
    }

    return helics::getTypeFromString(tstr);
}